

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VBufPack(N_Vector x,sunindextype param_2,int myid)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  char *pcVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  sunindextype size;
  
  uVar1 = N_VBufSize(x,&size);
  if (uVar1 == 0) {
    __ptr = malloc(size);
    if (__ptr == (void *)0x0) {
      pcVar4 = ">>> FAILED test -- malloc failed, Proc %d \n";
    }
    else {
      lVar3 = 0;
      if (param_2 < 1) {
        param_2 = lVar3;
      }
      for (; param_2 != lVar3; lVar3 = lVar3 + 1) {
        *(undefined8 *)((long)__ptr + lVar3 * 8) = 0;
      }
      N_VConst(0x3ff0000000000000,x);
      dVar6 = get_time();
      uVar1 = N_VBufPack(x,__ptr);
      sync_device(x);
      dVar7 = get_time();
      if (uVar1 != 0) {
        free(__ptr);
        pcVar4 = ">>> FAILED test -- N_VBufPack returned %d, Proc %d \n";
        goto LAB_0010cc04;
      }
      iVar5 = 0;
      for (lVar3 = 0; param_2 != lVar3; lVar3 = lVar3 + 1) {
        iVar2 = SUNRCompare(*(undefined8 *)((long)__ptr + lVar3 * 8),0x3ff0000000000000);
        iVar5 = iVar5 + iVar2;
      }
      if (iVar5 == 0) {
        if (myid == 0) {
          puts("PASSED test -- N_VBufPack");
        }
        max_time(x,dVar7 - dVar6);
        if (print_time != 0) {
          printf("%s Time: %22.15e\n\n","N_VBufPack");
        }
        free(__ptr);
        return 0;
      }
      free(__ptr);
      pcVar4 = ">>> FAILED test -- N_VBufPack failed, Proc %d \n";
    }
    printf(pcVar4,(ulong)(uint)myid);
  }
  else {
    pcVar4 = ">>> FAILED test -- N_VBufSize returned %d, Proc %d \n";
LAB_0010cc04:
    printf(pcVar4,(ulong)uVar1,(ulong)(uint)myid);
  }
  return 1;
}

Assistant:

int Test_N_VBufPack(N_Vector x, sunindextype local_length, int myid)
{
  int flag = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i, size;
  sunrealtype* buf;

  /* get buffer size */
  flag = N_VBufSize(x, &size);
  if (flag != 0)
  {
    printf(">>> FAILED test -- N_VBufSize returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* create and initialize buffer */
  buf = NULL;
  buf = (sunrealtype*)malloc((size_t)size);
  if (buf == NULL)
  {
    printf(">>> FAILED test -- malloc failed, Proc %d \n", myid);
    return (1);
  }

  for (i = 0; i < local_length; i++) { buf[i] = ZERO; }

  /* set vector data */
  N_VConst(ONE, x);

  /* fill buffer */
  start_time = get_time();
  flag       = N_VBufPack(x, (void*)buf);
  sync_device(x);
  stop_time = get_time();

  if (flag != 0)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* check buffer values */
  for (i = 0; i < local_length; i++) { failure += SUNRCompare(buf[i], ONE); }

  if (failure)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack failed, Proc %d \n", myid);
    return (1);
  }
  else if (myid == 0) { printf("PASSED test -- N_VBufPack\n"); }

  /* find max time across all processes */
  maxt = max_time(x, stop_time - start_time);
  PRINT_TIME("N_VBufPack", maxt);

  /* free buffer */
  free(buf);

  return (0);
}